

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

double atan2(double __y,double __x)

{
  int sz;
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *in_RDX;
  double *in_RSI;
  long lVar4;
  Fad<double> *in_RDI;
  double extraout_XMM0_Qa;
  double dVar5;
  STATE angle;
  double local_28;
  
  sz = *(int *)(in_RDX + 1);
  local_28 = atan2(*in_RSI,*in_RDX);
  Fad<double>::Fad(in_RDI,sz,&local_28);
  dVar5 = extraout_XMM0_Qa;
  if (0 < (long)sz) {
    dVar5 = *in_RDX * *in_RDX + *in_RSI * *in_RSI;
    dVar1 = in_RDX[2];
    dVar2 = in_RSI[2];
    pdVar3 = (in_RDI->dx_).ptr_to_data;
    lVar4 = 0;
    do {
      pdVar3[lVar4] =
           (*in_RDX * *(double *)((long)dVar2 + lVar4 * 8) -
           *in_RSI * *(double *)((long)dVar1 + lVar4 * 8)) / dVar5;
      lVar4 = lVar4 + 1;
    } while (sz != lVar4);
  }
  return dVar5;
}

Assistant:

static Fad<STATE> atan2(Fad<STATE> y, Fad<STATE> x)
{
    int sz = x.size();
    STATE xval,yval;
    xval = x.val();
    yval = y.val();
    STATE angle = atan2(yval,xval);
    Fad<STATE> result(sz,angle);
    STATE r = x.val()*x.val()+y.val()*y.val();
    for (int i=0; i<sz; i++) {
        result.fastAccessDx(i) = (-y.val()*x.fastAccessDx(i) + x.val()*y.fastAccessDx(i))/r;
    }
    return result;
}